

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenmesh::calculateabovepoint
          (tetgenmesh *this,arraypool *facpoints,point *ppa,point *ppb,point *ppc)

{
  point pa;
  double *pdVar1;
  point pdVar2;
  double *pb;
  long lVar3;
  point pc;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_48;
  double local_40;
  double local_38;
  
  pa = *(point *)*facpoints->toparray;
  if (facpoints->objects < 2) {
    pb = (point)0x0;
    dVar4 = 0.0;
  }
  else {
    lVar3 = 1;
    pb = (double *)0x0;
    dVar8 = 0.0;
    do {
      pdVar1 = *(double **)
                (facpoints->toparray[(uint)lVar3 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
                (long)(int)((uint)lVar3 & facpoints->objectsperblockmark) *
                (long)facpoints->objectbytes);
      dVar4 = (pdVar1[2] - pa[2]) * (pdVar1[2] - pa[2]) +
              (*pdVar1 - *pa) * (*pdVar1 - *pa) + (pdVar1[1] - pa[1]) * (pdVar1[1] - pa[1]);
      if (dVar4 <= dVar8) {
        dVar4 = dVar8;
        pdVar1 = pb;
      }
      pb = pdVar1;
      lVar3 = lVar3 + 1;
      dVar8 = dVar4;
    } while (facpoints->objects != lVar3);
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    if (1 < facpoints->objects) {
      dVar8 = *pa;
      dVar5 = pb[1] - pa[1];
      dVar6 = pb[2] - pa[2];
      lVar3 = 1;
      pc = (point)0x0;
      dVar7 = 0.0;
      do {
        pdVar1 = *(double **)
                  (facpoints->toparray[(uint)lVar3 >> ((byte)facpoints->log2objectsperblock & 0x1f)]
                  + (long)(int)((uint)lVar3 & facpoints->objectsperblockmark) *
                    (long)facpoints->objectbytes);
        dVar9 = pdVar1[1] - pa[1];
        dVar10 = pdVar1[2] - pa[2];
        local_48 = dVar5 * dVar10 - dVar6 * dVar9;
        local_40 = dVar10 * (*pb - dVar8) - dVar6 * (*pdVar1 - dVar8);
        local_38 = dVar9 * (*pb - dVar8) - (*pdVar1 - dVar8) * dVar5;
        dVar9 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
        if (dVar9 <= dVar7) {
          dVar9 = dVar7;
          pdVar1 = pc;
        }
        pc = pdVar1;
        lVar3 = lVar3 + 1;
        dVar7 = dVar9;
      } while (facpoints->objects != lVar3);
      local_40 = -local_40;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        facenormal((tetgenmesh *)(long)facpoints->objectbytes,pa,pb,pc,&local_48,1,(double *)0x0);
        dVar7 = SQRT(local_38 * local_38 + local_48 * local_48 + local_40 * local_40);
        dVar4 = dVar4 * 0.5;
        pdVar2 = this->dummypoint;
        *pdVar2 = (local_48 / dVar7) * dVar4 + dVar8;
        pdVar2[1] = (local_40 / dVar7) * dVar4 + pa[1];
        pdVar2[2] = dVar4 * (local_38 / dVar7) + pa[2];
        if (ppa == (point *)0x0) {
          return true;
        }
        *ppa = pa;
        *ppb = pb;
        *ppc = pc;
        return true;
      }
    }
    if (this->b->quiet == 0) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
             (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pb + (long)this->pointmarkindex * 4));
      return false;
    }
  }
  else if (this->b->quiet == 0) {
    printf("Warning:  All points of a facet are coincident with %d.\n",
           (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4));
    return false;
  }
  return false;
}

Assistant:

bool tetgenmesh::calculateabovepoint(arraypool *facpoints, point *ppa,
                                     point *ppb, point *ppc)
{
  point *ppt, pa, pb, pc;
  REAL v1[3], v2[3], n[3];
  REAL lab, len, A, area;
  REAL x, y, z;
  int i;

  ppt = (point *) fastlookup(facpoints, 0);
  pa = *ppt; // a is the first point.
  pb = pc = NULL; // Avoid compiler warnings.

  // Get a point b s.t. the length of [a, b] is maximal.
  lab = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    x = (*ppt)[0] - pa[0];
    y = (*ppt)[1] - pa[1];
    z = (*ppt)[2] - pa[2];
    len = x * x + y * y + z * z;
    if (len > lab) {
      lab = len;
      pb = *ppt;
    }
  }
  lab = sqrt(lab);
  if (lab == 0) {
    if (!b->quiet) {
      printf("Warning:  All points of a facet are coincident with %d.\n",
        pointmark(pa));
    }
    return false;
  }

  // Get a point c s.t. the area of [a, b, c] is maximal.
  v1[0] = pb[0] - pa[0];
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  A = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    v2[0] = (*ppt)[0] - pa[0];
    v2[1] = (*ppt)[1] - pa[1];
    v2[2] = (*ppt)[2] - pa[2];
    cross(v1, v2, n);
    area = dot(n, n);
    if (area > A) {
      A = area;
      pc = *ppt;
    }
  }
  if (A == 0) {
    // All points are collinear. No above point.
    if (!b->quiet) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
        pointmark(pa), pointmark(pb));
    }
    return false;
  }

  // Calculate an above point of this facet.
  facenormal(pa, pb, pc, n, 1, NULL);
  len = sqrt(dot(n, n));
  n[0] /= len;
  n[1] /= len;
  n[2] /= len;
  lab /= 2.0; // Half the maximal length.
  dummypoint[0] = pa[0] + lab * n[0];
  dummypoint[1] = pa[1] + lab * n[1];
  dummypoint[2] = pa[2] + lab * n[2];

  if (ppa != NULL) {
    // Return the three points.
    *ppa = pa;
    *ppb = pb;
    *ppc = pc;
  }

  return true;
}